

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdGetTaprootScriptTreeHash
              (void *handle,void *tree_handle,char *internal_pubkey,char **hash,char **tap_leaf_hash
              ,char **control_block)

{
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *this;
  bool bVar1;
  reference object;
  reference this_00;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  CfdException *this_01;
  allocator local_131;
  string local_130;
  void *local_110;
  SchnorrPubkey tapscript_hash;
  char *work_tap_leaf_hash;
  char *work_hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  ByteData control;
  TapBranch branch;
  
  local_110 = handle;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&branch,"TapscriptTree",(allocator *)&local_130);
  cfd::capi::CheckBuffer(tree_handle,(string *)&branch);
  std::__cxx11::string::~string((string *)&branch);
  bVar1 = cfd::capi::IsEmptyString(internal_pubkey);
  if (!bVar1) {
    cfd::core::TapBranch::TapBranch(&branch);
    this = *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
            ((long)tree_handle + 0x18);
    if ((this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
        _M_impl.super__Vector_impl_data._M_start ==
        (this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      this_00 = std::
                vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                ::at(*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                       **)((long)tree_handle + 0x10),0);
      if (tap_leaf_hash == (char **)0x0) {
        pcVar2 = (char *)0x0;
      }
      else {
        cfd::core::TaprootScriptTree::GetTapLeafHash(&tapscript_hash.data_,this_00);
        cfd::core::ByteData256::GetHex_abi_cxx11_(&local_130,&tapscript_hash.data_);
        pcVar2 = cfd::capi::CreateString(&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tapscript_hash);
      }
      cfd::core::TapBranch::operator=(&branch,&this_00->super_TapBranch);
    }
    else {
      object = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at(this,0);
      cfd::core::TapBranch::operator=(&branch,object);
      pcVar2 = (char *)0x0;
    }
    cfd::core::SchnorrPubkey::SchnorrPubkey(&tapscript_hash);
    std::__cxx11::string::string((string *)&local_130,internal_pubkey,&local_131);
    cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&local_d8,&local_130);
    cfd::core::TaprootUtil::CreateTapScriptControl
              (&control,(SchnorrPubkey *)&local_d8,&branch,&tapscript_hash,(Script *)0x0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d8);
    std::__cxx11::string::~string((string *)&local_130);
    if (hash == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_130,&tapscript_hash);
      pcVar3 = cfd::capi::CreateString(&local_130);
      std::__cxx11::string::~string((string *)&local_130);
    }
    if (control_block == (char **)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_130,&control);
      pcVar4 = cfd::capi::CreateString(&local_130);
      std::__cxx11::string::~string((string *)&local_130);
    }
    if (hash != (char **)0x0) {
      *hash = pcVar3;
    }
    if (pcVar2 != (char *)0x0 && tap_leaf_hash != (char **)0x0) {
      *tap_leaf_hash = pcVar2;
    }
    if (control_block != (char **)0x0) {
      *control_block = pcVar4;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&control);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tapscript_hash);
    cfd::core::TapBranch::~TapBranch(&branch);
    return 0;
  }
  branch._vptr_TapBranch = (_func_int **)0x4fb1b0;
  branch.has_leaf_ = true;
  branch.leaf_version_ = '\x04';
  branch._10_2_ = 0;
  branch.script_._vptr_Script = (_func_int **)anon_var_dwarf_74a9a1;
  cfd::core::logger::warn<>((CfdSourceLocation *)&branch,"internal_pubkey is null or empty.");
  this_01 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&branch,"Failed to parameter. internal_pubkey is null or empty.",
             (allocator *)&local_130);
  cfd::core::CfdException::CfdException(this_01,kCfdIllegalArgumentError,(string *)&branch);
  __cxa_throw(this_01,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTaprootScriptTreeHash(
    void* handle, void* tree_handle, const char* internal_pubkey, char** hash,
    char** tap_leaf_hash, char** control_block) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_hash = nullptr;
  char* work_tap_leaf_hash = nullptr;
  char* work_control_block = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    if (IsEmptyString(internal_pubkey)) {
      warn(CFD_LOG_SOURCE, "internal_pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. internal_pubkey is null or empty.");
    }
    TapBranch branch;
    if (!buffer->branch_buffer->empty()) {
      branch = buffer->branch_buffer->at(0);
    } else {
      auto& tree = buffer->tree_buffer->at(0);
      if (tap_leaf_hash != nullptr) {
        work_tap_leaf_hash = CreateString(tree.GetTapLeafHash().GetHex());
      }
      branch = tree;
    }
    SchnorrPubkey tapscript_hash;
    auto control = TaprootUtil::CreateTapScriptControl(
        SchnorrPubkey(internal_pubkey), branch, &tapscript_hash);

    if (hash != nullptr) {
      work_hash = CreateString(tapscript_hash.GetHex());
    }
    if (control_block != nullptr) {
      work_control_block = CreateString(control.GetHex());
    }

    if (hash != nullptr) *hash = work_hash;
    if ((tap_leaf_hash != nullptr) && (work_tap_leaf_hash != nullptr)) {
      *tap_leaf_hash = work_tap_leaf_hash;
    }
    if (control_block != nullptr) *control_block = work_control_block;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_hash, &work_tap_leaf_hash, &work_control_block);
  return result;
}